

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void StopHTTPServer(void)

{
  pointer ptVar1;
  pointer ppeVar2;
  bool bVar3;
  thread *thread;
  pointer ptVar4;
  pointer ppeVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  size_t n_connections;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = LogAcceptCategory(HTTP,Debug);
  if (bVar3) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "StopHTTPServer";
    logging_function._M_len = 0xe;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x20a,HTTP,Debug,(ConstevalFormatString<0U>)0xc8dfd5);
  }
  ppeVar5 = boundSockets.
            super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppeVar2 = boundSockets.
            super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>)
      g_work_queue._M_t.
      super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
      .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>)0x0) {
    bVar3 = LogAcceptCategory(HTTP,Debug);
    ptVar4 = g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar1 = g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (bVar3) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_00._M_len = 0x5e;
      logging_function_00._M_str = "StopHTTPServer";
      logging_function_00._M_len = 0xe;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,0x20c,HTTP,Debug,
                 (ConstevalFormatString<0U>)0xc8dfeb);
      ptVar4 = g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ptVar1 = g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    for (; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(&g_thread_http_workers);
    ppeVar5 = boundSockets.
              super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppeVar2 = boundSockets.
              super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppeVar5 != ppeVar2; ppeVar5 = ppeVar5 + 1) {
    evhttp_del_accept_socket(eventHTTP);
  }
  if (boundSockets.super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      boundSockets.super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    boundSockets.super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         boundSockets.
         super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  n_connections = HTTPRequestTracker::CountActiveConnections(&g_requests);
  if ((n_connections != 0) && (bVar3 = LogAcceptCategory(HTTP,Debug), bVar3)) {
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
    ;
    source_file_01._M_len = 0x5e;
    logging_function_01._M_str = "StopHTTPServer";
    logging_function_01._M_len = 0xe;
    LogPrintFormatInternal<unsigned_long>
              (logging_function_01,source_file_01,0x21a,HTTP,Debug,
               (ConstevalFormatString<1U>)0xc8e014,&n_connections);
  }
  HTTPRequestTracker::WaitUntilEmpty(&g_requests);
  if (eventHTTP != (evhttp *)0x0) {
    event_base_once(eventBase,0xffffffffffffffff,1,StopHTTPServer::anon_class_1_0_00000001::__invoke
                    ,0,0);
  }
  if (eventBase != (event_base *)0x0) {
    bVar3 = LogAcceptCategory(HTTP,Debug);
    if (bVar3) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_02._M_len = 0x5e;
      logging_function_02._M_str = "StopHTTPServer";
      logging_function_02._M_len = 0xe;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,0x228,HTTP,Debug,
                 (ConstevalFormatString<0U>)0xc8e044);
    }
    if (g_thread_http._M_id._M_thread != 0) {
      std::thread::join();
    }
    event_base_free(eventBase);
    eventBase = (event_base *)0x0;
  }
  std::__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>::reset
            ((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
              *)&g_work_queue,(pointer)0x0);
  bVar3 = LogAcceptCategory(HTTP,Debug);
  if (bVar3) {
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
    ;
    source_file_03._M_len = 0x5e;
    logging_function_03._M_str = "StopHTTPServer";
    logging_function_03._M_len = 0xe;
    LogPrintFormatInternal<>
              (logging_function_03,source_file_03,0x22e,HTTP,Debug,
               (ConstevalFormatString<0U>)0xc8e06b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void StopHTTPServer()
{
    LogDebug(BCLog::HTTP, "Stopping HTTP server\n");
    if (g_work_queue) {
        LogDebug(BCLog::HTTP, "Waiting for HTTP worker threads to exit\n");
        for (auto& thread : g_thread_http_workers) {
            thread.join();
        }
        g_thread_http_workers.clear();
    }
    // Unlisten sockets, these are what make the event loop running, which means
    // that after this and all connections are closed the event loop will quit.
    for (evhttp_bound_socket *socket : boundSockets) {
        evhttp_del_accept_socket(eventHTTP, socket);
    }
    boundSockets.clear();
    {
        if (const auto n_connections{g_requests.CountActiveConnections()}; n_connections != 0) {
            LogDebug(BCLog::HTTP, "Waiting for %d connections to stop HTTP server\n", n_connections);
        }
        g_requests.WaitUntilEmpty();
    }
    if (eventHTTP) {
        // Schedule a callback to call evhttp_free in the event base thread, so
        // that evhttp_free does not need to be called again after the handling
        // of unfinished request connections that follows.
        event_base_once(eventBase, -1, EV_TIMEOUT, [](evutil_socket_t, short, void*) {
            evhttp_free(eventHTTP);
            eventHTTP = nullptr;
        }, nullptr, nullptr);
    }
    if (eventBase) {
        LogDebug(BCLog::HTTP, "Waiting for HTTP event thread to exit\n");
        if (g_thread_http.joinable()) g_thread_http.join();
        event_base_free(eventBase);
        eventBase = nullptr;
    }
    g_work_queue.reset();
    LogDebug(BCLog::HTTP, "Stopped HTTP server\n");
}